

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRUndef * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::allocate<spirv_cross::SPIRUndef&>
          (ObjectPool<spirv_cross::SPIRUndef> *this,SPIRUndef *p)

{
  Vector<spirv_cross::SPIRUndef_*> *this_00;
  SPIRUndef *pSVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  SPIRUndef *ptr;
  SPIRUndef *local_40;
  SPIRUndef *local_38;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size;
  if (sVar2 == 0) {
    uVar3 = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar1 = (SPIRUndef *)malloc(uVar3 << 4);
    if (pSVar1 == (SPIRUndef *)0x0) {
      return (SPIRUndef *)0x0;
    }
    local_38 = pSVar1;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      local_40 = pSVar1;
      SmallVector<spirv_cross::SPIRUndef_*,_0UL>::push_back(this_00,&local_40);
      pSVar1 = pSVar1 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRUndef,spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRUndef*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRUndef,spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size;
  }
  pSVar1 = (this_00->super_VectorView<spirv_cross::SPIRUndef_*>).ptr[sVar2 - 1];
  SmallVector<spirv_cross::SPIRUndef_*,_0UL>::pop_back(this_00);
  (pSVar1->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar1->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_004658c8;
  *(undefined4 *)&(pSVar1->super_IVariant).field_0xc = *(undefined4 *)&(p->super_IVariant).field_0xc
  ;
  return pSVar1;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}